

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfStdIO.cpp
# Opt level: O3

void Imf_3_4::anon_unknown_0::checkError(ostream *os)

{
  int *piVar1;
  ErrnoExc *this;
  
  if (((byte)os[*(long *)(*(long *)os + -0x18) + 0x20] & 5) == 0) {
    return;
  }
  piVar1 = __errno_location();
  if (*piVar1 != 0) {
    Iex_3_4::throwErrnoExc();
  }
  this = (ErrnoExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ErrnoExc::ErrnoExc(this,"File output failed.");
  __cxa_throw(this,&Iex_3_4::ErrnoExc::typeinfo,Iex_3_4::ErrnoExc::~ErrnoExc);
}

Assistant:

void
checkError (ostream& os)
{
    if (!os)
    {
        if (errno) IEX_NAMESPACE::throwErrnoExc ();

        throw IEX_NAMESPACE::ErrnoExc ("File output failed.");
    }
}